

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int INT_EVmaster_assign_canonical_name(EVmaster master,char *given_name,char *canonical_name)

{
  FILE *pFVar1;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  char *pcVar5;
  char *in_RDX;
  long in_RSI;
  long *in_RDI;
  timespec ts_1;
  timespec ts;
  int node;
  timespec local_40;
  __time_t local_30;
  undefined4 local_28;
  CMTraceType in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar6;
  
  for (uVar6 = 0; (int)uVar6 < *(int *)((long)in_RDI + 0x34); uVar6 = uVar6 + 1) {
    if (*(long *)(in_RDI[7] + (long)(int)uVar6 * 0x38) == in_RSI) {
      if ((in_RDI[5] == 0) || (*(int *)(in_RDI[5] + 0x20) != 1)) {
        iVar2 = CMtrace_val[0xd];
        if (*(long *)(*in_RDI + 0x120) == 0) {
          iVar2 = CMtrace_init((CManager)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = *(FILE **)(*in_RDI + 0x120);
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_40);
            fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
          }
          fprintf(*(FILE **)(*in_RDI + 0x120),
                  "Canonical name assignment, node = %d, given name was %s, canonical is %s\n",
                  (ulong)uVar6,in_RSI,in_RDX);
        }
        fflush(*(FILE **)(*in_RDI + 0x120));
      }
      else {
        iVar2 = CMtrace_val[0xd];
        if (*(long *)(*in_RDI + 0x120) == 0) {
          iVar2 = CMtrace_init((CManager)CONCAT44(uVar6,in_stack_ffffffffffffffe0),
                               in_stack_ffffffffffffffdc);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            pFVar1 = *(FILE **)(*in_RDI + 0x120);
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar1,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&local_30);
            fprintf(*(FILE **)(*in_RDI + 0x120),"%lld.%.9ld - ",local_30,
                    CONCAT44(in_stack_ffffffffffffffdc,local_28));
          }
          fprintf(*(FILE **)(*in_RDI + 0x120),"Reconfigure canonical name assignment, node = %d\n",
                  (ulong)uVar6);
        }
        fflush(*(FILE **)(*in_RDI + 0x120));
      }
      pcVar5 = strdup(in_RDX);
      *(char **)(in_RDI[7] + (long)(int)uVar6 * 0x38 + 8) = pcVar5;
    }
  }
  return 1;
}

Assistant:

extern int
INT_EVmaster_assign_canonical_name(EVmaster master, char *given_name, char *canonical_name)
{
    int node;
    for (node = 0; node < master->node_count; node++) {
	if (master->nodes[node].name == given_name) {
	    if (master->dfg && (master->dfg->realized == 1)) {
		CMtrace_out(master->cm, EVdfgVerbose, "Reconfigure canonical name assignment, node = %d\n", node);
	    } else {
		CMtrace_out(master->cm, EVdfgVerbose, "Canonical name assignment, node = %d, given name was %s, canonical is %s\n", node, given_name, canonical_name);
	    }
	    master->nodes[node].canonical_name = strdup(canonical_name);
	}
    }
    return 1;
}